

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O3

void __thiscall QGraphicsBlurEffect::draw(QGraphicsBlurEffect *this,QPainter *painter)

{
  long lVar1;
  QGraphicsEffectSource *this_00;
  long *plVar2;
  char cVar3;
  long in_FS_OFFSET;
  qreal qVar4;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  qVar4 = QPixmapBlurFilter::radius(*(QPixmapBlurFilter **)(lVar1 + 0xa8));
  if (1.0 <= qVar4) {
    local_30 = 0;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsEffect::sourcePixmap
              ((QGraphicsEffect *)local_48,(CoordinateSystem)this,(QPoint *)0x1,
               (PixmapPadMode)&local_30);
    cVar3 = QPixmap::isNull();
    if (cVar3 == '\0') {
      local_58 = (double)(int)local_30;
      dStack_50 = (double)(int)((ulong)local_30 >> 0x20);
      plVar2 = *(long **)(lVar1 + 0xa8);
      (**(code **)(*plVar2 + 0x68))(plVar2,painter,&local_58,local_48);
    }
    QPixmap::~QPixmap((QPixmap *)local_48);
  }
  else {
    this_00 = *(QGraphicsEffectSource **)(*(long *)&(this->super_QGraphicsEffect).field_0x8 + 0x78);
    if (this_00 != (QGraphicsEffectSource *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QGraphicsEffectSource::draw(this_00,painter);
        return;
      }
      goto LAB_00393101;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00393101:
  __stack_chk_fail();
}

Assistant:

void QGraphicsBlurEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsBlurEffect);
    if (d->filter->radius() < 1) {
        drawSource(painter);
        return;
    }

    PixmapPadMode mode = PadToEffectiveBoundingRect;

    QPoint offset;
    QPixmap pixmap = sourcePixmap(Qt::LogicalCoordinates, &offset, mode);
    if (pixmap.isNull())
        return;

    d->filter->draw(painter, offset, pixmap);
}